

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.cpp
# Opt level: O3

btVector3 __thiscall
btConvexInternalShape::localGetSupportingVertex(btConvexInternalShape *this,btVector3 *vec)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float extraout_XMM0_Da_00;
  float fVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined8 uVar7;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  btVector3 bVar12;
  float local_48;
  float fStack_44;
  
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0x11])();
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  if ((extraout_XMM0_Da != 0.0) || (uVar7 = extraout_XMM0_Qa, NAN(extraout_XMM0_Da))) {
    fVar11 = vec->m_floats[2];
    uVar1 = *(ulong *)vec->m_floats;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar1;
    fVar4 = (float)(uVar1 >> 0x20);
    fVar4 = fVar11 * fVar11 + (float)uVar1 * (float)uVar1 + fVar4 * fVar4;
    uVar3 = (uint)(fVar4 < 1.4210855e-14);
    auVar5._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    auVar5._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    auVar5._8_8_ = 0;
    auVar5 = auVar5 & _DAT_001f04c0 | ~auVar5 & auVar8;
    if (fVar4 < 1.4210855e-14) {
      fVar11 = -1.0;
    }
    fVar4 = auVar5._0_4_;
    fVar6 = auVar5._4_4_;
    fVar10 = 1.0 / SQRT(fVar11 * fVar11 + fVar4 * fVar4 + fVar6 * fVar6);
    (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
    local_48 = (float)extraout_XMM0_Qa;
    fStack_44 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
    uVar7 = CONCAT44(fStack_44 + extraout_XMM0_Da_00 * fVar10 * fVar6,
                     local_48 + extraout_XMM0_Da_00 * fVar10 * fVar4);
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = in_XMM1_Qa;
    auVar9._4_12_ = auVar2._4_12_;
    auVar9._0_4_ = (float)in_XMM1_Qa + fVar11 * fVar10 * extraout_XMM0_Da_00;
    in_XMM1_Qa = auVar9._0_8_;
  }
  bVar12.m_floats[2] = (btScalar)(int)in_XMM1_Qa;
  bVar12.m_floats[3] = (btScalar)(int)((ulong)in_XMM1_Qa >> 0x20);
  bVar12.m_floats[0] = (btScalar)(int)uVar7;
  bVar12.m_floats[1] = (btScalar)(int)((ulong)uVar7 >> 0x20);
  return (btVector3)bVar12.m_floats;
}

Assistant:

btVector3	btConvexInternalShape::localGetSupportingVertex(const btVector3& vec)const
{
#ifndef __SPU__

	 btVector3	supVertex = localGetSupportingVertexWithoutMargin(vec);

	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;

#else
	btAssert(0);
	return btVector3(0,0,0);
#endif //__SPU__

 }